

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_radix_tree.c
# Opt level: O3

ngx_int_t ngx_radix32tree_delete(ngx_radix_tree_t *tree,uint32_t key,uint32_t mask)

{
  ngx_radix_node_t **ppnVar1;
  uint uVar2;
  ngx_int_t nVar3;
  ngx_radix_node_t *pnVar4;
  ngx_radix_node_t *pnVar5;
  ngx_radix_node_t *pnVar6;
  ngx_radix_node_t *pnVar7;
  
  pnVar4 = tree->root;
  if ((int)mask < 0 && pnVar4 != (ngx_radix_node_t *)0x0) {
    uVar2 = 0x80000000;
    do {
      pnVar4 = (&pnVar4->right)[(uVar2 & key) == 0];
      if (pnVar4 == (ngx_radix_node_t *)0x0) break;
      uVar2 = uVar2 >> 1;
    } while ((uVar2 & mask) != 0);
  }
  nVar3 = -1;
  if (pnVar4 != (ngx_radix_node_t *)0x0) {
    if ((pnVar4->right == (ngx_radix_node_t *)0x0) && (pnVar4->left == (ngx_radix_node_t *)0x0)) {
      pnVar6 = tree->free;
      pnVar7 = pnVar4->parent;
      do {
        pnVar5 = pnVar4;
        (&pnVar7->right)[pnVar7->right != pnVar5] = (ngx_radix_node_t *)0x0;
        pnVar5->right = pnVar6;
        if (((pnVar7->right != (ngx_radix_node_t *)0x0) || (pnVar7->left != (ngx_radix_node_t *)0x0)
            ) || (pnVar7->value != 0xffffffffffffffff)) break;
        ppnVar1 = &pnVar7->parent;
        pnVar4 = pnVar7;
        pnVar6 = pnVar5;
        pnVar7 = *ppnVar1;
      } while (*ppnVar1 != (ngx_radix_node_t *)0x0);
      tree->free = pnVar5;
    }
    else {
      if (pnVar4->value == 0xffffffffffffffff) {
        return -1;
      }
      pnVar4->value = 0xffffffffffffffff;
    }
    nVar3 = 0;
  }
  return nVar3;
}

Assistant:

ngx_int_t
ngx_radix32tree_delete(ngx_radix_tree_t *tree, uint32_t key, uint32_t mask)
{
    uint32_t           bit;
    ngx_radix_node_t  *node;

    bit = 0x80000000;
    node = tree->root;

    while (node && (bit & mask)) {
        if (key & bit) {
            node = node->right;

        } else {
            node = node->left;
        }

        bit >>= 1;
    }

    if (node == NULL) {
        return NGX_ERROR;
    }

    if (node->right || node->left) {
        if (node->value != NGX_RADIX_NO_VALUE) {
            node->value = NGX_RADIX_NO_VALUE;
            return NGX_OK;
        }

        return NGX_ERROR;
    }

    for ( ;; ) {
        if (node->parent->right == node) {
            node->parent->right = NULL;

        } else {
            node->parent->left = NULL;
        }

        node->right = tree->free;
        tree->free = node;

        node = node->parent;

        if (node->right || node->left) {
            break;
        }

        if (node->value != NGX_RADIX_NO_VALUE) {
            break;
        }

        if (node->parent == NULL) {
            break;
        }
    }

    return NGX_OK;
}